

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  archive *paVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  mode_t p;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  archive_entry *paVar9;
  ulong uVar10;
  char *pcVar11;
  size_t size_00;
  char *local_2e8;
  size_t size;
  uint local_2a4;
  time_t tStack_2a0;
  int perm;
  time_t epochTime;
  istringstream iss;
  undefined1 local_118 [8];
  string source_date_epoch;
  time_t t;
  time_t now;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  Entry local_98;
  Entry e;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string dest;
  cmLocaleRAII localeRAII;
  char *out;
  char *prefix_local;
  size_t skip_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  std::__cxx11::string::operator=((string *)&this->Error,"");
  sVar7 = strlen(file);
  if (sVar7 <= skip) {
    return true;
  }
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  local_2e8 = prefix;
  if (prefix == (char *)0x0) {
    local_2e8 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,local_2e8,&local_79);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::operator+=((string *)local_78,file + skip);
  if ((this->Verbose & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_78);
    std::operator<<(poVar8,"\n");
  }
  Entry::Entry(&local_98);
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,file,&local_b9);
  cm_archive_entry_copy_sourcepath(paVar9,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  cm_archive_entry_copy_pathname(paVar9,(string *)local_78);
  paVar1 = this->Disk;
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  iVar5 = archive_read_disk_entry_from_file(paVar1,paVar9,-1,(stat *)0x0);
  if (iVar5 == 0) {
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      time(&t);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      source_date_epoch.field_2._8_8_ = cm_get_date(t,pcVar11);
      if (source_date_epoch.field_2._8_8_ == -1) {
        std::__cxx11::string::operator=((string *)&this->Error,"unable to parse mtime \'");
        std::__cxx11::string::operator+=((string *)&this->Error,(string *)&this->MTime);
        std::__cxx11::string::operator+=((string *)&this->Error,"\'");
        this_local._7_1_ = false;
        goto LAB_0042077e;
      }
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      archive_entry_set_mtime(paVar9,source_date_epoch.field_2._8_8_,0);
    }
    else {
      std::__cxx11::string::string((string *)local_118);
      cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_118);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&epochTime,(string *)local_118,_S_in);
        std::istream::operator>>(&epochTime,&stack0xfffffffffffffd60);
        bVar3 = std::ios::eof();
        if (((bVar3 & 1) != 0) && (bVar3 = std::ios::fail(), (bVar3 & 1) == 0)) {
          paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
          archive_entry_set_mtime(paVar9,tStack_2a0,0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&epochTime);
      }
      std::__cxx11::string::~string((string *)local_118);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Uid);
    if ((bVar4) && (bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Gid), bVar4)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      iVar5 = cmArchiveWriteOptional<int>::Get(&this->Uid);
      archive_entry_set_uid(paVar9,(long)iVar5);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      iVar5 = cmArchiveWriteOptional<int>::Get(&this->Gid);
      archive_entry_set_gid(paVar9,(long)iVar5);
    }
    uVar10 = std::__cxx11::string::empty();
    if (((uVar10 & 1) == 0) && (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_uname(paVar9,pcVar11);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_gname(paVar9,pcVar11);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Permissions);
    if (bVar4) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      p = cmArchiveWriteOptional<int>::Get(&this->Permissions);
      archive_entry_set_perm(paVar9,p);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->PermissionsMask);
    if (bVar4) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      local_2a4 = archive_entry_perm(paVar9);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      uVar2 = local_2a4;
      uVar6 = cmArchiveWriteOptional<int>::Get(&this->PermissionsMask);
      archive_entry_set_perm(paVar9,uVar2 & uVar6);
    }
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_acl_clear(paVar9);
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_xattr_clear(paVar9);
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_set_fflags(paVar9,0,0);
    bVar4 = std::operator==(&this->Format,"pax");
    if ((bVar4) || (bVar4 = std::operator==(&this->Format,"paxr"), bVar4)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      archive_entry_sparse_clear(paVar9);
    }
    paVar1 = this->Archive;
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    iVar5 = archive_write_header(paVar1,paVar9);
    if (iVar5 == 0) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = archive_entry_symlink(paVar9);
      if (pcVar11 == (char *)0x0) {
        paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
        size_00 = archive_entry_size(paVar9);
        if (size_00 != 0) {
          this_local._7_1_ = AddData(this,file,size_00);
          goto LAB_0042077e;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_header: ");
      cm_archive_error_string_abi_cxx11_((string *)&size,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&size);
      std::__cxx11::string::~string((string *)&size);
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Error,"Unable to read from file \'");
    std::__cxx11::string::operator+=((string *)&this->Error,file);
    std::__cxx11::string::operator+=((string *)&this->Error,"\': ");
    cm_archive_error_string_abi_cxx11_(&local_e0,this->Disk);
    std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_local._7_1_ = false;
  }
LAB_0042077e:
  now._4_4_ = 1;
  Entry::~Entry(&local_98);
  std::__cxx11::string::~string((string *)local_78);
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file, size_t skip, const char* prefix)
{
  this->Error = "";
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if (skip >= strlen(file)) {
    return true;
  }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix ? prefix : "";
  dest += out;
  if (this->Verbose) {
    std::cout << dest << "\n";
  }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if (archive_read_disk_entry_from_file(this->Disk, e, -1, nullptr) !=
      ARCHIVE_OK) {
    this->Error = "Unable to read from file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
  }
  if (!this->MTime.empty()) {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1) {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
    }
    archive_entry_set_mtime(e, t, 0);
  } else {
    std::string source_date_epoch;
    cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
    if (!source_date_epoch.empty()) {
      std::istringstream iss(source_date_epoch);
      time_t epochTime;
      iss >> epochTime;
      if (iss.eof() && !iss.fail()) {
        archive_entry_set_mtime(e, epochTime, 0);
      }
    }
  }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet()) {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
  }

  if (!this->Uname.empty() && !this->Gname.empty()) {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
  }

  // manages the permissions
  if (this->Permissions.IsSet()) {
    archive_entry_set_perm(e, this->Permissions.Get());
  }

  if (this->PermissionsMask.IsSet()) {
    int perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
  }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr") {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
  }

  if (archive_write_header(this->Archive, e) != ARCHIVE_OK) {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
  }

  // do not copy content of symlink
  if (!archive_entry_symlink(e)) {
    // Content.
    if (size_t size = static_cast<size_t>(archive_entry_size(e))) {
      return this->AddData(file, size);
    }
  }
  return true;
}